

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_pipeline(ConvolutionDepthWise_x86 *this,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar8;
  int *piVar6;
  Allocator *pAVar7;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  Layer *pLVar13;
  undefined1 auVar14 [16];
  ParamDict pd;
  Allocator *local_48;
  
  if ((this->super_ConvolutionDepthWise).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_ConvolutionDepthWise).activation_type) {
  case 1:
    pLVar13 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 2:
    pLVar13 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_ConvolutionDepthWise).activation_params.data);
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 3:
    pLVar13 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data
                                   + 4));
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 4:
    pLVar13 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 5:
    pLVar13 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  case 6:
    pLVar13 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data
                                   + 4));
    (*pLVar13->_vptr_Layer[2])(pLVar13,&pd);
    break;
  default:
    pLVar13 = (Layer *)0x0;
    goto LAB_00393944;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar13->_vptr_Layer[4])(pLVar13,opt);
LAB_00393944:
  this->activation = pLVar13;
  if ((opt->use_int8_inference == true) &&
     ((this->super_ConvolutionDepthWise).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar5 = (this->super_ConvolutionDepthWise).kernel_w;
  uVar8 = (this->super_ConvolutionDepthWise).kernel_h;
  uVar12 = (this->super_ConvolutionDepthWise).group;
  uVar9 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)(int)uVar12;
  uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
          (long)(int)(uVar8 * uVar5);
  uVar11 = (this->super_ConvolutionDepthWise).num_output;
  if ((uVar12 == uVar11) &&
     (uVar11 = (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                    (long)((int)uVar11 / (int)uVar12)) * uVar12, uVar11 == uVar12)) {
    if (((uVar12 & 3) == 0) && (opt->use_packing_layout != false)) {
      Mat::reshape((Mat *)&pd,&(this->super_ConvolutionDepthWise).weight_data,uVar8 * uVar5,uVar12,
                   (Allocator *)0x0);
      convert_packing((Mat *)&pd,&this->weight_data_tm,4,opt);
      if (pd.d != (ParamDictPrivate *)0x0) {
        LOCK();
        (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
        UNLOCK();
        if ((pd.d)->params[0].type == 0) {
          if (local_48 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_48->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_00393b3f;
    }
    uVar1 = (this->super_ConvolutionDepthWise).dilation_w;
    uVar2 = (this->super_ConvolutionDepthWise).dilation_h;
    auVar14._0_4_ = -(uint)(uVar5 == 3);
    auVar14._4_4_ = -(uint)(uVar8 == 3);
    auVar14._8_4_ = -(uint)(uVar1 == 1);
    auVar14._12_4_ = -(uint)(uVar2 == 1);
    uVar12 = movmskps(uVar11,auVar14);
    iVar3 = (this->super_ConvolutionDepthWise).stride_w;
    iVar4 = (this->super_ConvolutionDepthWise).stride_h;
    if ((iVar4 == 1 && (iVar3 == 1 && (uVar12 ^ 0xf) == 0)) ||
       ((iVar4 == 2 && iVar3 == 2) && (char)(uVar12 ^ 0xf) == '\0')) {
      piVar6 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->weight_data_tm).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pAVar7 = (this->weight_data_tm).allocator;
          if (pAVar7 == (Allocator *)0x0) {
            free((this->weight_data_tm).data);
          }
          else {
            (*pAVar7->_vptr_Allocator[3])();
          }
        }
      }
      piVar6 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      (this->weight_data_tm).data = (this->super_ConvolutionDepthWise).weight_data.data;
      (this->weight_data_tm).refcount = piVar6;
      (this->weight_data_tm).elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      (this->weight_data_tm).elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
      (this->weight_data_tm).allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
      iVar3 = (this->super_ConvolutionDepthWise).weight_data.w;
      iVar4 = (this->super_ConvolutionDepthWise).weight_data.h;
      iVar10 = (this->super_ConvolutionDepthWise).weight_data.d;
      (this->weight_data_tm).dims = (this->super_ConvolutionDepthWise).weight_data.dims;
      (this->weight_data_tm).w = iVar3;
      (this->weight_data_tm).h = iVar4;
      (this->weight_data_tm).d = iVar10;
      (this->weight_data_tm).c = (this->super_ConvolutionDepthWise).weight_data.c;
      (this->weight_data_tm).cstep = (this->super_ConvolutionDepthWise).weight_data.cstep;
      goto LAB_00393b3f;
    }
  }
  create_group_ops(this,opt);
LAB_00393b3f:
  if (opt->lightmode == true) {
    piVar6 = (this->super_ConvolutionDepthWise).weight_data.refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        pAVar7 = (this->super_ConvolutionDepthWise).weight_data.allocator;
        if (pAVar7 == (Allocator *)0x0) {
          free((this->super_ConvolutionDepthWise).weight_data.data);
        }
        else {
          (*pAVar7->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_ConvolutionDepthWise).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.elemsize + 4) = 0;
    (this->super_ConvolutionDepthWise).weight_data.data = (void *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.dims = 0;
    (this->super_ConvolutionDepthWise).weight_data.w = 0;
    (this->super_ConvolutionDepthWise).weight_data.h = 0;
    (this->super_ConvolutionDepthWise).weight_data.d = 0;
    (this->super_ConvolutionDepthWise).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}